

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall Logger::~Logger(Logger *this)

{
  ostream *poVar1;
  int *in_RDI;
  
  poVar1 = GetStream((LogSeverity)((ulong)in_RDI >> 0x20));
  poVar1 = std::operator<<(poVar1,"\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  if (*in_RDI == 3) {
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    abort();
  }
  return;
}

Assistant:

Logger::~Logger() {
  GetStream(severity_) << "\n" << std::flush;
  if (severity_ == FATAL) {
    info_log_file_.close();
    warn_log_file_.close();
    erro_log_file_.close();
    abort();
  }
}